

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDMeshFragment * __thiscall
ON_SubDHeap::AllocateMeshFragment
          (ON_SubDHeap *this,uint subd_display_density,ON_SubDMeshFragment *src_fragment)

{
  ON_FixedSizePoolElement **ppOVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  size_t *psVar5;
  ON_FixedSizePoolElement *pOVar6;
  size_t sVar7;
  long lVar8;
  void *pvVar9;
  ON_SubDMeshFragment *pOVar10;
  ON_SubDMeshFragment *this_00;
  long lVar11;
  uint display_density;
  ulong uVar12;
  uint uVar13;
  ON_SleepLockGuard guard;
  
  if (6 < subd_display_density) goto LAB_00615236;
  uVar12 = 0xffffffff;
  if (src_fragment->m_face_fragment_count == 1) {
    uVar12 = (ulong)subd_display_density;
  }
  if (1 < src_fragment->m_face_fragment_count) {
    uVar12 = (ulong)(subd_display_density - 1);
  }
  display_density = (uint)uVar12;
  if (display_density == 0xffffffff) goto LAB_00615236;
  uVar3 = ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(display_density);
  uVar13 = (uVar3 + 1) * (uVar3 + 1);
  uVar3 = ON_SubDMeshFragment::VertexCount(src_fragment);
  if ((uVar3 != 0) &&
     (uVar3 = ON_SubDMeshFragment::VertexCount(src_fragment), uVar3 < (uVar13 & 0xfffd)))
  goto LAB_00615236;
  uVar3 = this->m_full_fragment_display_density;
  if (uVar3 == 0) {
    bVar2 = Internal_InitializeFragmentCountEstimates(this,subd_display_density);
    if (!bVar2) goto LAB_00615236;
    uVar3 = this->m_full_fragment_display_density;
  }
  if (uVar3 - 6 < 0xfffffffb) goto LAB_00615236;
  lVar8 = 600;
  if (display_density + 1 == uVar3) {
    lVar8 = 0x210;
  }
  lVar11 = 0x1c8;
  if (display_density != uVar3) {
    lVar11 = lVar8;
  }
  this_00 = (ON_SubDMeshFragment *)((long)&this->m_ws + lVar11);
  sVar4 = ON_FixedSizePool::SizeofElement((ON_FixedSizePool *)this_00);
  if (sVar4 == 0) {
    if (display_density == uVar3) {
      uVar3 = this->m_full_fragment_display_density;
      lVar8 = 0x1bc;
LAB_006152ab:
      sVar7 = (size_t)*(uint *)((long)&this->m_ws + lVar8);
      psVar5 = g_sizeof_fragment + uVar3;
      sVar4 = 0x20;
    }
    else {
      if (display_density + 1 == uVar3) {
        uVar3 = this->m_full_fragment_display_density - 1;
        lVar8 = 0x1c0;
        goto LAB_006152ab;
      }
      psVar5 = g_sizeof_fragment + 6;
      sVar4 = 1;
      sVar7 = 4;
    }
    bVar2 = Internal_InitializeMeshFragmentPool(*psVar5,sVar7,sVar4,(ON_FixedSizePool *)this_00);
    if (!bVar2) {
LAB_00615236:
      ON_SubDIncrementErrorCount();
      return (ON_SubDMeshFragment *)0x0;
    }
  }
  ON_SleepLockGuard::ON_SleepLockGuard(&guard,(ON_FixedSizePool *)this_00);
  pOVar10 = (ON_SubDMeshFragment *)this->m_unused_fragments[uVar12];
  if (pOVar10 == (ON_SubDMeshFragment *)0x0) {
    pOVar6 = (ON_FixedSizePoolElement *)
             ON_FixedSizePool::AllocateDirtyElement((ON_FixedSizePool *)this_00);
    if (pOVar6 == (ON_FixedSizePoolElement *)0x0) {
      ON_SubDIncrementErrorCount();
      bVar2 = false;
      goto LAB_00615310;
    }
    sVar7 = ON_FixedSizePool::SizeofElement((ON_FixedSizePool *)this_00);
    ppOVar1 = &pOVar6->m_next;
    this->m_unused_fragments[uVar12] = pOVar6;
    pOVar6->m_next = (ON_FixedSizePoolElement *)0x0;
    sVar4 = g_sizeof_fragment[uVar12];
    pvVar9 = (void *)((long)&pOVar6->m_next + sVar4 * 2);
    while( true ) {
      pOVar6 = (ON_FixedSizePoolElement *)((long)&pOVar6->m_next + sVar4);
      pOVar10 = (ON_SubDMeshFragment *)this->m_unused_fragments[uVar12];
      if ((void *)((long)ppOVar1 + sVar7) < pvVar9) break;
      pOVar6->m_next = (ON_FixedSizePoolElement *)pOVar10;
      this->m_unused_fragments[uVar12] = pOVar6;
      pvVar9 = (void *)((long)pvVar9 + sVar4);
    }
  }
  this->m_unused_fragments[uVar12] = (ON_FixedSizePoolElement *)pOVar10->m_reserved;
  bVar2 = true;
  this_00 = pOVar10;
LAB_00615310:
  ON_SleepLockGuard::~ON_SleepLockGuard(&guard);
  if (!bVar2) {
    return (ON_SubDMeshFragment *)0x0;
  }
  memcpy(this_00,&ON_SubDMeshFragment::Empty,0x248);
  this_00->m_next_fragment = (ON_SubDMeshFragment *)0x0;
  this_00->m_prev_fragment = (ON_SubDMeshFragment *)0x0;
  ON_SubDMeshFragment::Internal_LayoutArrays
            (this_00,(ulong)(uVar13 & 0xfffd),(double *)(this_00 + 1));
  uVar3 = ON_SubDMeshFragment::VertexCount(src_fragment);
  if (uVar3 != 0) {
    ON_SubDMeshFragment::CopyFrom(this_00,src_fragment,display_density);
    return this_00;
  }
  return this_00;
}

Assistant:

ON_SubDMeshFragment* ON_SubDHeap::AllocateMeshFragment(
  unsigned subd_display_density,
  const ON_SubDMeshFragment& src_fragment
)
{
  if (subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  // When 4 == ON_SubDDisplayParameters::DefaultDensity (setting used in February 2019)
  // quads get a single fragment with a 16x16 face grid
  // N-gons with N != 4 get N 8x8 grids.

  // density = density of src_fragment
  const unsigned int density = (src_fragment.m_face_fragment_count > 1)
    ? ((subd_display_density > 0) ? (subd_display_density -1) : ON_UNSET_UINT_INDEX)
    : ((1==src_fragment.m_face_fragment_count) ? subd_display_density : ON_UNSET_UINT_INDEX)
    ;
  if (ON_UNSET_UINT_INDEX == density)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const unsigned count = (unsigned)(sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]));
  if (density >= count)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned short side_seg_count = (unsigned short)ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(density);
  const unsigned short vertex_capacity = (side_seg_count + 1)*(side_seg_count + 1);
  if ( src_fragment.VertexCount() > 0 && src_fragment.VertexCount() < ((unsigned)vertex_capacity) )
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (0 == m_full_fragment_display_density)
  {
    // Lazy initialization of m_full_fragment_display_density is done because
    // we don't know the display density when SubDs are being constructed.
    if (false == Internal_InitializeFragmentCountEstimates(subd_display_density))
      return ON_SUBD_RETURN_ERROR(nullptr);
  }
  if (m_full_fragment_display_density <= 0 || m_full_fragment_display_density >= ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  // In all common situations, bUseFullFragmentFSP or bUsePartFragmentFSP is true.
  const bool bUseFullFragmentFSP = (density == this->m_full_fragment_display_density);
  const bool bUsePartFragmentFSP = (density+1 == this->m_full_fragment_display_density);

  ON_FixedSizePool& fsp 
    = bUseFullFragmentFSP
    ? m_fsp_full_fragments
    : bUsePartFragmentFSP ? m_fsp_part_fragments : m_fsp_oddball_fragments;

  if (0 == fsp.SizeofElement())
  {
    // Lazy initialization of the fragment fixed size pools
    // is done so that we don't reserve pool memory that never gets used.

    const size_t sizeof_fragment
      = bUseFullFragmentFSP
      ? ON_SubDHeap::g_sizeof_fragment[m_full_fragment_display_density]
      : (bUsePartFragmentFSP ? ON_SubDHeap::g_sizeof_fragment[m_full_fragment_display_density - 1U] : ON_SubDHeap::g_sizeof_fragment[ON_SubDDisplayParameters::MaximumDensity])
      ;

    const size_t fragment_count_estimate
      = bUseFullFragmentFSP
      ? m_full_fragment_count_estimate
      : (bUsePartFragmentFSP ? m_part_fragment_count_estimate : ((unsigned)4U))
      ;

    const size_t min_fsp_2nd_block_element_count = (bUseFullFragmentFSP || bUsePartFragmentFSP) ? 32 : 1;

    if (false == this->Internal_InitializeMeshFragmentPool(
      sizeof_fragment,
      fragment_count_estimate,
      min_fsp_2nd_block_element_count,
      fsp
    ))
    {
      return ON_SUBD_RETURN_ERROR(nullptr);
    }
  }

  ON_SubDMeshFragment* fragment;
  {
    char* p = nullptr;
    char* p1 = nullptr;
    ON_SleepLockGuard guard(fsp);
    if (nullptr == m_unused_fragments[density])
    {
      p = (char*)fsp.AllocateDirtyElement();
      if (nullptr == p)
        return ON_SUBD_RETURN_ERROR(nullptr);
      p1 = p + fsp.SizeofElement();
      m_unused_fragments[density] = (ON_FixedSizePoolElement*)p;
      m_unused_fragments[density]->m_next = nullptr;
      const size_t sizeof_fragment = ON_SubDHeap::g_sizeof_fragment[density];
      for (p += sizeof_fragment; p + sizeof_fragment <= p1; p += sizeof_fragment)
      {
        // This loop is rarely executed.
        // It is used when an unusual small fragment is allocated from a pool
        // providing large fragments (fsp.SizeofElement() > sizeof_fragment).
        // If fsp.SizeofElement() is not an even multiple of sizeof_fragment,
        // then some memory is wasted. Because this situation is uncommon,
        // the waste doesn't matter in the big scheme of things.
        ON_FixedSizePoolElement* ele = (ON_FixedSizePoolElement*)p;
        ele->m_next = m_unused_fragments[density];
        m_unused_fragments[density] = ele;          
      }
    }
    fragment = (ON_SubDMeshFragment*)m_unused_fragments[density];
    m_unused_fragments[density] = m_unused_fragments[density]->m_next;
  }

  // NO // *fragment = src_fragment;
  *fragment = ON_SubDMeshFragment::Empty;
  fragment->m_prev_fragment = nullptr;
  fragment->m_next_fragment = nullptr;

  // NOTE WELL:
  //   fragment and fragment array memory are from a single fixed size pool allocation.
  fragment->Internal_LayoutArrays(vertex_capacity, (double*)(fragment + 1) );

  if (src_fragment.VertexCount() > 0)
    fragment->CopyFrom(src_fragment,density);

  return fragment;
}